

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media_test.cpp
# Opt level: O1

void __thiscall HenyeyGreenstein_Normalized_Test::TestBody(HenyeyGreenstein_Normalized_Test *this)

{
  byte bVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  char *message;
  ulong uVar5;
  ulong uVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  Stratified2DIter __begin2;
  float fVar19;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff30;
  undefined1 auVar20 [16];
  double in_stack_ffffffffffffff48;
  float fVar21;
  float fVar22;
  Stratified2DIter local_88;
  undefined1 local_68 [16];
  AssertHelper local_50;
  undefined1 local_48 [16];
  undefined1 extraout_var [56];
  
  uVar5 = 0x853c49e6748fea9b;
  fVar19 = -0.75;
  do {
    uVar6 = uVar5 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar5;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar6;
    auVar15 = vpunpcklqdq_avx(auVar16,auVar9);
    auVar8 = vpsrlvq_avx2(auVar15,_DAT_005655d0);
    auVar9 = vpsrlvq_avx2(auVar15,_DAT_005655c0);
    auVar8 = vpshufd_avx(auVar9 ^ auVar8,0xe8);
    auVar15 = vpsrlq_avx(auVar15,0x3b);
    auVar15 = vpshufd_avx(auVar15,0xe8);
    auVar8 = vprorvd_avx512vl(auVar8,auVar15);
    auVar15 = vcvtudq2ps_avx512vl(auVar8);
    auVar8._8_4_ = 0x2f800000;
    auVar8._0_8_ = 0x2f8000002f800000;
    auVar8._12_4_ = 0x2f800000;
    auVar9 = vmulps_avx512vl(auVar15,auVar8);
    auVar15._8_4_ = 0x3f7fffff;
    auVar15._0_8_ = 0x3f7fffff3f7fffff;
    auVar15._12_4_ = 0x3f7fffff;
    uVar5 = vcmpps_avx512vl(auVar9,auVar15,1);
    bVar1 = (byte)(uVar5 >> 1);
    auVar8 = vmovshdup_avx(auVar9);
    local_48 = vfmadd132ss_fma(ZEXT416((uint)(bVar1 & 1) * auVar8._0_4_ +
                                       (uint)!(bool)(bVar1 & 1) * 0x3f7fffff),
                               SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000));
    auVar8 = vfnmadd213ss_fma(local_48,local_48,SUB6416(ZEXT464(0x3f800000),0));
    auVar8 = vmaxss_avx(auVar8,ZEXT816(0));
    if (auVar8._0_4_ < 0.0) {
      fVar10 = sqrtf(auVar8._0_4_);
    }
    else {
      auVar8 = vsqrtss_avx(auVar8,auVar8);
      fVar10 = auVar8._0_4_;
    }
    fVar7 = (float)((uint)((byte)uVar5 & 1) * (int)(auVar9._0_4_ * 6.2831855) +
                   (uint)!(bool)((byte)uVar5 & 1) * 0x40c90fda);
    fVar11 = cosf(fVar7);
    fVar12 = sinf(fVar7);
    local_88.super_RNGIterator<pbrt::detail::Stratified2DIter>.
    super_IndexingIterator<pbrt::detail::Stratified2DIter>.i = 0;
    local_88.super_RNGIterator<pbrt::detail::Stratified2DIter>.
    super_IndexingIterator<pbrt::detail::Stratified2DIter>.n = 0x1000;
    local_88.super_RNGIterator<pbrt::detail::Stratified2DIter>.rng.inc = 1;
    local_88.super_RNGIterator<pbrt::detail::Stratified2DIter>.rng.state =
         (uint64_t)&DAT_5851f42d4c957f2e;
    local_88.nx = 0x40;
    local_88.ny = 0x40;
    auVar8 = vfmadd213ss_fma(ZEXT416((uint)fVar19),ZEXT416((uint)fVar19),
                             SUB6416(ZEXT464(0x3f800000),0));
    fVar22 = fVar19 + fVar19;
    auVar15 = vfnmadd213ss_fma(ZEXT416((uint)fVar19),ZEXT416((uint)fVar19),
                               SUB6416(ZEXT464(0x3f800000),0));
    fVar21 = auVar15._0_4_ * 0.07957747;
    auVar15 = ZEXT416((uint)fVar7);
    do {
      auVar20 = auVar15;
      auVar17._0_8_ = pbrt::detail::Stratified2DIter::operator*(&local_88);
      auVar17._8_56_ = extraout_var;
      auVar16 = auVar17._0_16_;
      auVar9 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar16,ZEXT416(0xc0000000));
      auVar15 = vfnmadd213ss_fma(auVar9,auVar9,SUB6416(ZEXT464(0x3f800000),0));
      auVar15 = vmaxss_avx(auVar15,ZEXT816(0));
      if (auVar15._0_4_ < 0.0) {
        local_68 = auVar16;
        fVar7 = sqrtf(auVar15._0_4_);
        auVar16 = local_68;
      }
      else {
        auVar15 = vsqrtss_avx(auVar15,auVar15);
        fVar7 = auVar15._0_4_;
      }
      auVar15 = vmovshdup_avx(auVar16);
      fVar14 = auVar15._0_4_ * 6.2831855;
      fVar13 = cosf(fVar14);
      local_68._0_4_ = fVar13 * fVar7;
      fVar14 = sinf(fVar14);
      auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * fVar7 * fVar10 * fVar12)),
                                ZEXT416((uint)local_68._0_4_),ZEXT416((uint)(fVar10 * fVar11)));
      auVar15 = vfmadd132ss_fma(ZEXT416(auVar9._0_4_),auVar15,ZEXT416((uint)local_48._0_4_));
      auVar15 = vfmadd213ss_fma(auVar15,ZEXT416((uint)fVar22),ZEXT416(auVar8._0_4_));
      auVar18._0_12_ = ZEXT812(0);
      auVar18._12_4_ = 0;
      auVar15 = vmaxss_avx(auVar15,auVar18);
      if (auVar15._0_4_ < 0.0) {
        sqrtf(auVar15._0_4_);
      }
      else {
        vsqrtss_avx(auVar15,auVar15);
      }
      auVar2._12_4_ = 0;
      auVar2._0_12_ = auVar20._4_12_;
      iVar4 = local_88.super_RNGIterator<pbrt::detail::Stratified2DIter>.
              super_IndexingIterator<pbrt::detail::Stratified2DIter>.i + 1;
      local_88.super_RNGIterator<pbrt::detail::Stratified2DIter>.
      super_IndexingIterator<pbrt::detail::Stratified2DIter>.i = iVar4;
      auVar15 = auVar2 << 0x20;
    } while (iVar4 != 0x1000);
    testing::internal::DoubleNearPredFormat
              ((char *)in_stack_ffffffffffffff30.ptr_,(char *)CONCAT44(fVar19,fVar7),
               (char *)0x265e3c,(double)CONCAT44(fVar22,fVar21),in_stack_ffffffffffffff48,
               auVar20._8_8_);
    if ((char)local_88.super_RNGIterator<pbrt::detail::Stratified2DIter>.
              super_IndexingIterator<pbrt::detail::Stratified2DIter>.i == '\0') {
      testing::Message::Message((Message *)&stack0xffffffffffffff30);
      message = "";
      if ((undefined8 *)local_88.super_RNGIterator<pbrt::detail::Stratified2DIter>.rng.state !=
          (undefined8 *)0x0) {
        message = *(char **)local_88.super_RNGIterator<pbrt::detail::Stratified2DIter>.rng.state;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/media_test.cpp"
                 ,0x4e,message);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&stack0xffffffffffffff30);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (in_stack_ffffffffffffff30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (in_stack_ffffffffffffff30.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)in_stack_ffffffffffffff30.ptr_ + 8))();
        }
        in_stack_ffffffffffffff30.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_88.super_RNGIterator<pbrt::detail::Stratified2DIter>.rng,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar5 = uVar6 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
    fVar19 = fVar19 + 0.25;
  } while (fVar19 <= 0.75);
  return;
}

Assistant:

TEST(HenyeyGreenstein, Normalized) {
    RNG rng;
    for (float g = -.75; g <= 0.75; g += 0.25) {
        HGPhaseFunction hg(g);
        Vector3f wo = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
        Float sum = 0;
        int sqrtSamples = 64;
        int nSamples = sqrtSamples * sqrtSamples;
        for (Point2f u : Stratified2D(sqrtSamples, sqrtSamples)) {
            Vector3f wi = SampleUniformSphere(u);
            sum += hg.p(wo, wi);
        }
        // Phase function should integrate to 1/4pi.
        EXPECT_NEAR(sum / nSamples, 1. / (4. * Pi), 1e-3f);
    }
}